

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::DumpRecursively(FunctionBody *dumpFunction)

{
  NestedArray *pNVar1;
  uint uVar2;
  FunctionInfo *this;
  FunctionBody *dumpFunction_00;
  uint i;
  uint index;
  
  FunctionProxy::EnsureDeserialized((FunctionProxy *)dumpFunction);
  Dump(dumpFunction);
  index = 0;
  while( true ) {
    pNVar1 = (dumpFunction->super_ParseableFunctionInfo).nestedArray.ptr;
    uVar2 = 0;
    if (pNVar1 != (NestedArray *)0x0) {
      uVar2 = pNVar1->nestedCount;
    }
    if (uVar2 <= index) break;
    ParseableFunctionInfo::GetNestedFunctionForExecution
              (&dumpFunction->super_ParseableFunctionInfo,index);
    this = ParseableFunctionInfo::GetNestedFunc(&dumpFunction->super_ParseableFunctionInfo,index);
    dumpFunction_00 = FunctionInfo::GetFunctionBody(this);
    DumpRecursively(dumpFunction_00);
    index = index + 1;
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpRecursively(FunctionBody* dumpFunction)
    {
        dumpFunction->EnsureDeserialized();
        ByteCodeDumper::Dump(dumpFunction);
        for (uint i = 0; i < dumpFunction->GetNestedCount(); i ++)
        {
            dumpFunction->GetNestedFunctionForExecution(i);
            ByteCodeDumper::DumpRecursively(dumpFunction->GetNestedFunc(i)->GetFunctionBody());
        }
    }